

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_open_file_guard(writer *w,string_view *file_name,char impl)

{
  char local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  char *local_78;
  char *format;
  const_iterator local_60;
  value_type_conflict *c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  string mangled_name;
  char impl_local;
  string_view *file_name_local;
  writer *w_local;
  
  mangled_name.field_2._M_local_buf[0xf] = impl;
  write_include_guard(w);
  ::std::__cxx11::string::string((string *)&__range1);
  __begin1 = (const_iterator)file_name;
  __end1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(file_name);
  c = std::basic_string_view<char,_std::char_traits<char>_>::end
                ((basic_string_view<char,_std::char_traits<char>_> *)__begin1);
  for (; __end1 != c; __end1 = __end1 + 1) {
    local_60 = __end1;
    if (*__end1 == '.') {
      local_89 = '_';
    }
    else {
      local_89 = *__end1;
    }
    ::std::__cxx11::string::operator+=((string *)&__range1,local_89);
  }
  if (mangled_name.field_2._M_local_buf[0xf] != '\0') {
    ::std::__cxx11::string::operator+=((string *)&__range1,'_');
    ::std::__cxx11::string::operator+=((string *)&__range1,mangled_name.field_2._M_local_buf[0xf]);
  }
  local_78 = "#ifndef WINRT_%_H\n#define WINRT_%_H\n";
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"#ifndef WINRT_%_H\n#define WINRT_%_H\n");
  writer_base<cppwinrt::writer>::write<std::__cxx11::string,std::__cxx11::string>
            (&w->super_writer_base<cppwinrt::writer>,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  ::std::__cxx11::string::~string((string *)&__range1);
  return;
}

Assistant:

static void write_open_file_guard(writer& w, std::string_view const& file_name, char impl = 0)
    {
        write_include_guard(w);
            
        std::string mangled_name;

        for (auto&& c : file_name)
        {
            mangled_name += c == '.' ? '_' : c;
        }

        if (impl)
        {
            mangled_name += '_';
            mangled_name += impl;
        }

        auto format = R"(#ifndef WINRT_%_H
#define WINRT_%_H
)";

        w.write(format, mangled_name, mangled_name);
    }